

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZVec<double>,_10>::Resize(TPZManVector<TPZVec<double>,_10> *this,int64_t newsize)

{
  void *pvVar1;
  ulong *puVar2;
  TPZVec<double> *pTVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  TPZVec<double> *pTVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar5 = (this->super_TPZVec<TPZVec<double>_>).fNElements;
    if (lVar5 != newsize) {
      lVar6 = (this->super_TPZVec<TPZVec<double>_>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0xb) {
          pTVar3 = (this->super_TPZVec<TPZVec<double>_>).fStore;
          pTVar7 = this->fExtAlloc;
          if (pTVar3 != pTVar7) {
            if (0 < lVar5) {
              lVar6 = 0;
              lVar5 = 0;
              do {
                TPZVec<double>::operator=
                          ((TPZVec<double> *)((long)&pTVar7->_vptr_TPZVec + lVar6),
                           (TPZVec<double> *)
                           ((long)&((this->super_TPZVec<TPZVec<double>_>).fStore)->_vptr_TPZVec +
                           lVar6));
                lVar5 = lVar5 + 1;
                lVar6 = lVar6 + 0x20;
              } while (lVar5 < (this->super_TPZVec<TPZVec<double>_>).fNElements);
              pTVar3 = (this->super_TPZVec<TPZVec<double>_>).fStore;
            }
            if (pTVar3 != (TPZVec<double> *)0x0) {
              lVar5 = pTVar3[-1].fNAlloc;
              if (lVar5 != 0) {
                lVar6 = lVar5 << 5;
                do {
                  *(undefined ***)((long)&pTVar3[-1]._vptr_TPZVec + lVar6) = &PTR__TPZVec_01813df0;
                  pvVar1 = *(void **)((long)pTVar3 + lVar6 + -0x18);
                  if (pvVar1 != (void *)0x0) {
                    operator_delete__(pvVar1);
                  }
                  lVar6 = lVar6 + -0x20;
                } while (lVar6 != 0);
              }
              operator_delete__(&pTVar3[-1].fNAlloc,lVar5 << 5 | 8);
            }
            (this->super_TPZVec<TPZVec<double>_>).fStore = pTVar7;
          }
          (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZVec<double>_>).fNAlloc = 0;
        }
        else {
          dVar8 = (double)lVar6 * 1.2;
          uVar4 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar4 = newsize;
          }
          puVar2 = (ulong *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar4 * 0x20 | 8);
          *puVar2 = uVar4;
          pTVar7 = (TPZVec<double> *)(puVar2 + 1);
          if (uVar4 != 0) {
            pTVar3 = pTVar7;
            do {
              pTVar3->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              pTVar3->fStore = (double *)0x0;
              pTVar3->fNElements = 0;
              pTVar3->fNAlloc = 0;
              pTVar3 = pTVar3 + 1;
            } while (pTVar3 != pTVar7 + uVar4);
          }
          if (0 < lVar5) {
            lVar5 = 0;
            lVar6 = 0;
            do {
              TPZVec<double>::operator=
                        ((TPZVec<double> *)((long)&pTVar7->_vptr_TPZVec + lVar5),
                         (TPZVec<double> *)
                         ((long)&((this->super_TPZVec<TPZVec<double>_>).fStore)->_vptr_TPZVec +
                         lVar5));
              lVar6 = lVar6 + 1;
              lVar5 = lVar5 + 0x20;
            } while (lVar6 < (this->super_TPZVec<TPZVec<double>_>).fNElements);
          }
          pTVar3 = (this->super_TPZVec<TPZVec<double>_>).fStore;
          if (pTVar3 != (TPZVec<double> *)0x0 && pTVar3 != this->fExtAlloc) {
            lVar5 = pTVar3[-1].fNAlloc;
            if (lVar5 != 0) {
              lVar6 = lVar5 << 5;
              do {
                *(undefined ***)((long)&pTVar3[-1]._vptr_TPZVec + lVar6) = &PTR__TPZVec_01813df0;
                pvVar1 = *(void **)((long)pTVar3 + lVar6 + -0x18);
                if (pvVar1 != (void *)0x0) {
                  operator_delete__(pvVar1);
                }
                lVar6 = lVar6 + -0x20;
              } while (lVar6 != 0);
            }
            operator_delete__(&pTVar3[-1].fNAlloc,lVar5 << 5 | 8);
          }
          (this->super_TPZVec<TPZVec<double>_>).fStore = pTVar7;
          (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZVec<double>_>).fNAlloc = uVar4;
        }
      }
      else {
        (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}